

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::syntax::RsProdSyntax*>::emplace_back<slang::syntax::RsProdSyntax*>
          (SmallVectorBase<slang::syntax::RsProdSyntax*> *this,RsProdSyntax **args)

{
  iterator ppRVar1;
  RsProdSyntax **args_local;
  SmallVectorBase<slang::syntax::RsProdSyntax_*> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    ppRVar1 = SmallVectorBase<slang::syntax::RsProdSyntax_*>::end
                        ((SmallVectorBase<slang::syntax::RsProdSyntax_*> *)this);
    this_local = (SmallVectorBase<slang::syntax::RsProdSyntax_*> *)
                 emplaceRealloc<slang::syntax::RsProdSyntax*>(this,ppRVar1,args);
  }
  else {
    ppRVar1 = SmallVectorBase<slang::syntax::RsProdSyntax_*>::end
                        ((SmallVectorBase<slang::syntax::RsProdSyntax_*> *)this);
    *ppRVar1 = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    this_local = (SmallVectorBase<slang::syntax::RsProdSyntax_*> *)
                 SmallVectorBase<slang::syntax::RsProdSyntax_*>::back
                           ((SmallVectorBase<slang::syntax::RsProdSyntax_*> *)this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }